

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdp.cpp
# Opt level: O2

bool __thiscall CMDPSTATE::AddPred(CMDPSTATE *this,int stateID)

{
  bool bVar1;
  int local_c;
  
  local_c = stateID;
  bVar1 = ContainsPred(this,stateID);
  if (!bVar1) {
    std::vector<int,_std::allocator<int>_>::push_back(&this->PredsID,&local_c);
  }
  return true;
}

Assistant:

bool CMDPSTATE::AddPred(int stateID)
{
    //add the predecessor
    if (!ContainsPred(stateID)) {
#if MEM_CHECK
        DisableMemCheck();
#endif

        PredsID.push_back(stateID);
#if MEM_CHECK
        EnableMemCheck();
#endif
    }

    return true;
}